

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O2

void __thiscall depspawn::internal::TaskPool::Task::run(Task *this)

{
  Workitem *pWVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  
  pWVar1 = this->ctx_;
  if (pWVar1 != (Workitem *)0x0) {
    pWVar1->status = Running;
    uVar2 = *(undefined8 *)(in_FS_OFFSET + -8);
    *(Workitem **)(in_FS_OFFSET + -8) = pWVar1;
    std::function<void_()>::operator()(&this->func_);
    *(undefined8 *)(in_FS_OFFSET + -8) = uVar2;
    (*this->ctx_->_vptr_Workitem[2])();
    return;
  }
  std::function<void_()>::operator()(&this->func_);
  return;
}

Assistant:

void TaskPool::Task::run()
  {
    if (ctx_) {
      ctx_->status = Workitem::Status_t::Running;

      Workitem *& ref_father_lcl = enum_thr_spec_father;
      Workitem * const prev_enum_thr_spec_father = ref_father_lcl;
      ref_father_lcl = ctx_;

      func_();

      ref_father_lcl = prev_enum_thr_spec_father;

      ctx_->finish_execution();
    } else {
      func_();
    }
  }